

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastZ32R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  RepeatedField<int> *this;
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this_00;
  uchar uVar4;
  int8_t iVar5;
  bool bVar6;
  uint16_t uVar7;
  unsigned_short uVar8;
  int32_t value;
  uint uVar9;
  char *pcVar10;
  uint *puVar11;
  ulong uVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_298;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_290;
  uchar local_281;
  int tmp;
  uchar expected_tag;
  RepeatedField<int> *field;
  uint64_t local_270;
  TcParseTableBase *local_268;
  ParseContext *local_260;
  char *local_258;
  MessageLite *local_250;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_248;
  TcFieldData local_240;
  TcFieldData local_238;
  undefined1 local_229;
  uint64_t uStack_228;
  bool always_return;
  TcParseTableBase *local_220;
  ParseContext *local_218;
  char *local_210;
  MessageLite *local_208;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_200;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1f8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1f0;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  ulong local_100;
  int64_t res;
  ulong local_e8;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  char *local_b8;
  char *local_b0;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  local_270 = hasbits;
  local_268 = table;
  local_260 = ctx;
  local_258 = ptr;
  local_250 = msg;
  local_248 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_248);
  pMVar2 = local_250;
  pcVar10 = local_258;
  pPVar1 = local_260;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&field);
    pcVar10 = MiniParse(pMVar2,pcVar10,pPVar1,(TcFieldData)field,local_268,local_270);
    return pcVar10;
  }
  uVar7 = TcFieldData::offset((TcFieldData *)&local_248);
  _tmp = RefAt<google::protobuf::RepeatedField<int>>(pMVar2,(ulong)uVar7);
  local_281 = UnalignedLoad<unsigned_char>(local_258);
  do {
    local_258 = local_258 + 1;
    last.p = &local_b8;
    res2 = (int64_t)&local_b8;
    local_b8 = local_258;
    iVar5 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last);
    local_100 = (ulong)iVar5;
    if (iVar5 < '\0') {
      local_91 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last);
      local_a8 = &res3;
      res3 = (long)local_91 << 7 | local_100 >> 0x39;
      local_39 = local_91;
      if (res3 < 0) {
        local_79 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last);
        local_90 = &local_e8;
        local_e8 = (long)local_79 << 0xe | local_100 >> 0x32;
        local_29 = local_79;
        if ((long)local_e8 < 0) {
          local_61 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last);
          local_78 = &res3;
          res3 = ((long)local_61 << 0x15 | local_100 >> 0x2b) & res3;
          local_19 = local_61;
          if (res3 < 0) {
            local_49 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last);
            local_60 = &local_e8;
            local_e8 = ((long)local_49 << 0x1c | local_100 >> 0x24) & local_e8;
            local_9 = local_49;
            if (((((long)local_e8 < 0) &&
                 (iVar5 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last),
                 ((int)iVar5 & 0x80U) != 0)) &&
                (iVar5 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last),
                ((int)iVar5 & 0x80U) != 0)) &&
               (((iVar5 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last),
                 ((int)iVar5 & 0x80U) != 0 &&
                 (iVar5 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last),
                 ((int)iVar5 & 0x80U) != 0)) &&
                ((iVar5 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()(&last),
                 iVar5 != '\x01' &&
                 (iVar5 = ShiftMixParseVarint<int,_10>::anon_class_8_1_54a39810::operator()
                                    ((anon_class_8_1_54a39810 *)&res2), ((int)iVar5 & 0x80U) != 0)))
                ))) {
              local_b0 = (char *)0x0;
              goto LAB_01a8ae3a;
            }
          }
        }
        res3 = local_e8 & res3;
      }
      local_100 = res3 & local_100;
      if (local_b8 == (char *)0x0) {
        protobuf_assumption_failed
                  ("p != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/varint_shuffle.h"
                   ,0x91);
      }
      local_b0 = local_b8;
    }
    else {
      local_b0 = local_b8;
    }
LAB_01a8ae3a:
    pMVar2 = local_250;
    pPVar1 = local_260;
    this = _tmp;
    local_258 = local_b0;
    if (local_b0 == (char *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_290);
      pcVar10 = Error(pMVar2,(char *)0x0,pPVar1,(TcFieldData)local_290,local_268,local_270);
      return pcVar10;
    }
    value = internal::(anonymous_namespace)::ZigZagDecodeHelper<int,true>((int32_t)local_100);
    RepeatedField<int>::Add(this,value);
    bVar6 = EpsCopyInputStream::DataAvailable(&local_260->super_EpsCopyInputStream,local_258);
    pMVar2 = local_250;
    pcVar10 = local_258;
    if (((bVar6 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_298);
      if (local_268->has_bits_offset != 0) {
        uVar9 = (uint)local_270;
        puVar11 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_268->has_bits_offset);
        *puVar11 = uVar9 | *puVar11;
      }
      return pcVar10;
    }
    uVar4 = UnalignedLoad<unsigned_char>(local_258);
    local_208 = local_250;
    local_210 = local_258;
    local_218 = local_260;
    if (uVar4 != local_281) {
      TcFieldData::TcFieldData(&data_local);
      local_200 = data_local.field_0;
      local_220 = local_268;
      uStack_228 = local_270;
      local_229 = 0;
      bVar6 = EpsCopyInputStream::DataAvailable(&local_218->super_EpsCopyInputStream,local_210);
      pMVar2 = local_208;
      pcVar10 = local_210;
      pPVar1 = local_218;
      if (!bVar6) {
        TcFieldData::TcFieldData(&local_238);
        if (local_220->has_bits_offset != 0) {
          uVar9 = (uint)uStack_228;
          puVar11 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_220->has_bits_offset);
          *puVar11 = uVar9 | *puVar11;
        }
        return pcVar10;
      }
      TcFieldData::TcFieldData(&local_240);
      this_00 = local_220;
      uVar3 = uStack_228;
      uVar8 = UnalignedLoad<unsigned_short>(pcVar10);
      uVar12 = (ulong)(int)((uint)uVar8 & (uint)this_00->fast_idx_mask);
      if ((uVar12 & 7) == 0) {
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(this_00,uVar12 >> 3);
        local_1f0.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar8;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_1f8.data = local_1f0.data;
        pcVar10 = (*UNRECOVERED_JUMPTABLE)
                            (pMVar2,pcVar10,pPVar1,(TcFieldData)local_1f0,this_00,uVar3);
        return pcVar10;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ32R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<int32_t, uint8_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}